

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,int opcode)

{
  Kind kind;
  Kind KVar1;
  BinaryReader<mp::internal::IdentityConverter> *pBVar2;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *pNVar3;
  char *pcVar4;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar5;
  double dVar6;
  int iVar7;
  LogicalExpr LVar8;
  NumericExpr NVar9;
  Impl *pIVar10;
  Reference RVar11;
  CountExpr CVar12;
  ExprBase EVar13;
  ExprBase EVar14;
  NumericExpr NVar15;
  int num_breakpoints;
  long lVar16;
  Impl *impl;
  ulong uVar17;
  PLTermBuilder PVar18;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)46,_(mp::expr::Kind)46>_>
  BVar19;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
  BVar20;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
  local_58;
  ArgList local_40;
  
  kind = OpCodeInfo::INFO[opcode].kind;
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  switch(KVar1) {
  case IF:
    LVar8 = ReadLogicalExpr(this);
    pBVar2 = this->reader_;
    pcVar4 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
    NVar9 = ReadNumericExpr(this,*pcVar4,false);
    pBVar2 = this->reader_;
    pcVar4 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
    NVar15 = ReadNumericExpr(this,*pcVar4,false);
    pBVar5 = this->handler_->builder_;
    local_58.impl_ = (Impl *)0x0;
    std::
    vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
    ::emplace_back<mp::internal::ExprBase::Impl_const*>
              ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                *)&(pBVar5->super_ExprFactory).exprs_,(Impl **)&local_58);
    EVar14.impl_ = (Impl *)operator_new__(0x100);
    (EVar14.impl_)->kind_ = IF;
    (pBVar5->super_ExprFactory).exprs_.
    super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1] = EVar14.impl_;
    *(ExprBase *)&EVar14.impl_[2].kind_ = LVar8.super_ExprBase.impl_;
    *(ExprBase *)&EVar14.impl_[4].kind_ = NVar9.super_ExprBase.impl_;
    *(ExprBase *)&EVar14.impl_[6].kind_ = NVar15.super_ExprBase.impl_;
    break;
  case PLTERM:
    iVar7 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
    if (iVar7 < 2) {
      local_58.impl_ = (Impl *)0x0;
      local_58.arg_index_ = 0;
      local_58._12_4_ = 0;
      local_40.types_ = 0;
      local_40.field_1.values_ = (Value *)&local_58;
      BinaryReaderBase::ReportError
                (&this->reader_->super_BinaryReaderBase,(CStringRef)0x22942f,&local_40);
    }
    num_breakpoints = iVar7 + -1;
    PVar18 = BasicExprFactory<std::allocator<char>_>::BeginPLTerm
                       (&this->handler_->builder_->super_ExprFactory,num_breakpoints);
    uVar17 = PVar18._8_8_;
    EVar14.impl_ = &(PVar18.impl_)->super_Impl;
    if (1 < iVar7) {
      do {
        pBVar2 = this->reader_;
        pcVar4 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
        dVar6 = ReadConstant(this,*pcVar4);
        ((Impl *)EVar14.impl_)->data[(int)uVar17 * 2] = dVar6;
        pBVar2 = this->reader_;
        pcVar4 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
        dVar6 = ReadConstant(this,*pcVar4);
        *(double *)((long)((Impl *)EVar14.impl_)->data + ((long)(int)(uVar17 >> 0x1f) << 3 | 8U)) =
             dVar6;
        uVar17 = (uVar17 & 0xffffffff00000000 | (ulong)((int)uVar17 + 1)) + 0x100000000;
        num_breakpoints = num_breakpoints + -1;
      } while (num_breakpoints != 0);
    }
    pBVar2 = this->reader_;
    pcVar4 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
    dVar6 = ReadConstant(this,*pcVar4);
    ((Impl *)EVar14.impl_)->data[(int)uVar17 * 2] = dVar6;
    RVar11 = ReadReference(this);
    ((Impl *)EVar14.impl_)->arg =
         (Impl *)RVar11.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
    break;
  case FIRST_ITERATED:
    iVar7 = ReadNumArgs(this,1);
    BVar20 = BasicExprFactory<std::allocator<char>>::
             BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
                       ((BasicExprFactory<std::allocator<char>> *)this->handler_->builder_,kind,
                        iVar7);
    EVar14.impl_ = &(BVar20.impl_)->super_Impl;
    if (0 < iVar7) {
      lVar16 = 0;
      do {
        pBVar2 = this->reader_;
        pcVar4 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
        EVar13.impl_ = (Impl *)ReadNumericExpr(this,*pcVar4,false);
        ((Impl *)EVar14.impl_)->args[BVar20.arg_index_ + lVar16] = EVar13.impl_;
        lVar16 = lVar16 + 1;
      } while (iVar7 != (int)lVar16);
    }
    break;
  case SUM:
    iVar7 = ReadNumArgs(this,3);
    BVar20 = BasicExprFactory<std::allocator<char>>::
             BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
                       ((BasicExprFactory<std::allocator<char>> *)this->handler_->builder_,SUM,iVar7
                       );
    EVar14.impl_ = &(BVar20.impl_)->super_Impl;
    if (0 < iVar7) {
      lVar16 = 0;
      do {
        pBVar2 = this->reader_;
        pcVar4 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
        EVar13.impl_ = (Impl *)ReadNumericExpr(this,*pcVar4,false);
        ((Impl *)EVar14.impl_)->args[BVar20.arg_index_ + lVar16] = EVar13.impl_;
        lVar16 = lVar16 + 1;
      } while (iVar7 != (int)lVar16);
    }
    break;
  case LAST_ITERATED:
    iVar7 = ReadNumArgs(this,1);
    pBVar2 = this->reader_;
    pNVar3 = this->handler_;
    pcVar4 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
    EVar14.impl_ = (Impl *)ReadNumericExpr(this,*pcVar4,false);
    BVar20 = BasicExprFactory<std::allocator<char>>::
             BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
                       ((BasicExprFactory<std::allocator<char>> *)pNVar3->builder_,LAST_ITERATED,
                        iVar7);
    local_58.impl_ = BVar20.impl_;
    (local_58.impl_)->args[BVar20.arg_index_] = EVar14.impl_;
    local_58.arg_index_ = BVar20.arg_index_ + 1;
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::NumericExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                *)this,iVar7 + -1,&local_58);
    EVar14.impl_ = &(local_58.impl_)->super_Impl;
    break;
  case NUMBEROF_SYM:
    iVar7 = ReadNumArgs(this,1);
    pNVar3 = this->handler_;
    EVar13.impl_ = (Impl *)ReadSymbolicExpr(this);
    BVar19 = BasicExprFactory<std::allocator<char>>::
             BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)46,(mp::expr::Kind)46>>
                       ((BasicExprFactory<std::allocator<char>> *)pNVar3->builder_,NUMBEROF_SYM,
                        iVar7);
    EVar14.impl_ = &(BVar19.impl_)->super_Impl;
    ((Impl *)EVar14.impl_)->args[BVar19.arg_index_] = EVar13.impl_;
    if (1 < iVar7) {
      lVar16 = 0;
      do {
        EVar13.impl_ = (Impl *)ReadSymbolicExpr(this);
        ((Impl *)((long)EVar14.impl_ + 0x10))->args[(long)BVar19.arg_index_ + lVar16 + -1] =
             EVar13.impl_;
        lVar16 = lVar16 + 1;
      } while (iVar7 + -1 != (int)lVar16);
    }
    break;
  case COUNT:
    CVar12 = ReadCountExpr(this);
    return (NumericExpr)
           CVar12.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_;
  default:
    if (KVar1 == ADD) {
      pBVar2 = this->reader_;
      pcVar4 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
      NVar9 = ReadNumericExpr(this,*pcVar4,false);
      pBVar2 = this->reader_;
      pcVar4 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
      NVar15 = ReadNumericExpr(this,*pcVar4,false);
      pBVar5 = this->handler_->builder_;
      local_58.impl_ = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar5->super_ExprFactory).exprs_,(Impl **)&local_58);
      pIVar10 = (Impl *)operator_new__(0xc0);
      pIVar10->kind_ = kind;
      (pBVar5->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar10;
      *(ExprBase *)&pIVar10[2].kind_ = NVar9.super_ExprBase.impl_;
      *(ExprBase *)&pIVar10[4].kind_ = NVar15.super_ExprBase.impl_;
      return (NumericExpr)pIVar10;
    }
    if (KVar1 == FIRST_UNARY) {
      pBVar2 = this->reader_;
      pNVar3 = this->handler_;
      pcVar4 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
      NVar9 = ReadNumericExpr(this,*pcVar4,false);
      pBVar5 = pNVar3->builder_;
      local_58.impl_ = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar5->super_ExprFactory).exprs_,(Impl **)&local_58);
      pIVar10 = (Impl *)operator_new__(0x80);
      pIVar10->kind_ = kind;
      (pBVar5->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar10;
      *(ExprBase *)&pIVar10[2].kind_ = NVar9.super_ExprBase.impl_;
      return (NumericExpr)pIVar10;
    }
  case CALL:
  case LAST_VARARG:
    local_58.impl_ = (Impl *)0x0;
    local_58.arg_index_ = 0;
    local_58._12_4_ = 0;
    local_40.types_ = 0;
    local_40.field_1.values_ = (Value *)&local_58;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x229457,&local_40);
    EVar14.impl_ = (Impl *)0x0;
  }
  return (NumericExpr)(ExprBase)EVar14.impl_;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}